

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_SpaceReusePoisonsAndUnpoisonsMemory_Test::
~ArenaTest_SpaceReusePoisonsAndUnpoisonsMemory_Test
          (ArenaTest_SpaceReusePoisonsAndUnpoisonsMemory_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, SpaceReusePoisonsAndUnpoisonsMemory) {
  if constexpr (!internal::HasMemoryPoisoning()) {
    GTEST_SKIP() << "Memory poisoning not enabled.";
  }

  char buf[1024]{};
  constexpr int kSize = 32;
  {
    Arena arena(buf, sizeof(buf));
    std::vector<void*> pointers;
    for (int i = 0; i < 100; ++i) {
      void* p = Arena::CreateArray<char>(&arena, kSize);
      // Simulate other ASan client managing shadow memory.
      internal::PoisonMemoryRegion(p, kSize);
      internal::UnpoisonMemoryRegion(p, kSize - 4);
      pointers.push_back(p);
    }
    for (void* p : pointers) {
      internal::ArenaTestPeer::ReturnArrayMemory(&arena, p, kSize);
      // The first one is not poisoned because it becomes the freelist.
      if (p != pointers[0]) {
        EXPECT_TRUE(internal::IsMemoryPoisoned(p));
      }
    }

    bool found_poison = false;
    for (char& c : buf) {
      if (internal::IsMemoryPoisoned(&c)) {
        found_poison = true;
        break;
      }
    }
    EXPECT_TRUE(found_poison);
  }

  // Should not be poisoned after destruction.
  for (char& c : buf) {
    ASSERT_FALSE(internal::IsMemoryPoisoned(&c));
  }
}